

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

bool __thiscall wabt::WastParser::ParseElemExprOpt(WastParser *this,ExprList *out_elem_expr)

{
  bool bVar1;
  Enum EVar2;
  size_type sVar3;
  Result local_50;
  Enum local_4c;
  undefined4 local_48;
  Result local_44;
  undefined1 local_40 [8];
  ExprList exprs;
  bool item;
  ExprList *out_elem_expr_local;
  WastParser *this_local;
  
  exprs.size_._7_1_ = MatchLpar(this,Item);
  intrusive_list<wabt::Expr>::intrusive_list((intrusive_list<wabt::Expr> *)local_40);
  if ((exprs.size_._7_1_ & 1) == 0) {
    local_50 = ParseExpr(this,(ExprList *)local_40);
    EVar2 = Result::operator_cast_to_Enum(&local_50);
    if (EVar2 != Ok) {
      this_local._7_1_ = false;
      goto LAB_002193a9;
    }
  }
  else {
    local_44 = ParseTerminatingInstrList(this,(ExprList *)local_40);
    EVar2 = Result::operator_cast_to_Enum(&local_44);
    if (EVar2 != Ok) {
      this_local._7_1_ = false;
      goto LAB_002193a9;
    }
    local_4c = (Enum)Expect(this,Rpar);
    bVar1 = Failed((Result)local_4c);
    if (bVar1) {
      this_local._7_1_ = true;
      goto LAB_002193a9;
    }
  }
  sVar3 = intrusive_list<wabt::Expr>::size((intrusive_list<wabt::Expr> *)local_40);
  if (sVar3 == 0) {
    this_local._7_1_ = false;
  }
  else {
    intrusive_list<wabt::Expr>::operator=(out_elem_expr,(intrusive_list<wabt::Expr> *)local_40);
    this_local._7_1_ = true;
  }
LAB_002193a9:
  local_48 = 1;
  intrusive_list<wabt::Expr>::~intrusive_list((intrusive_list<wabt::Expr> *)local_40);
  return this_local._7_1_;
}

Assistant:

bool WastParser::ParseElemExprOpt(ExprList* out_elem_expr) {
  WABT_TRACE(ParseElemExprOpt);
  bool item = MatchLpar(TokenType::Item);
  ExprList exprs;
  if (item) {
    if (ParseTerminatingInstrList(&exprs) != Result::Ok) {
      return false;
    }
    EXPECT(Rpar);
  } else {
    if (ParseExpr(&exprs) != Result::Ok) {
      return false;
    }
  }
  if (!exprs.size()) {
    return false;
  }
  *out_elem_expr = std::move(exprs);
  return true;
}